

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_check_zero_block(aec_stream *strm)

{
  uint32_t *puVar1;
  int iVar2;
  internal_state *piVar3;
  code *pcVar4;
  ulong uVar5;
  
  piVar3 = strm->state;
  uVar5 = 0;
  do {
    if (strm->block_size <= uVar5) {
      iVar2 = piVar3->zero_blocks;
      piVar3->zero_blocks = iVar2 + 1;
      if (iVar2 == 0) {
        piVar3->zero_ref = piVar3->ref;
        piVar3->zero_ref_sample = piVar3->ref_sample;
      }
      if ((piVar3->blocks_avail == 0) || ((piVar3->blocks_dispensed & 0x3f) == 0)) {
        pcVar4 = m_encode_zero;
        if (3 < iVar2) {
          piVar3->zero_blocks = -1;
        }
      }
      else {
        pcVar4 = m_get_block;
      }
      goto LAB_00101e91;
    }
    puVar1 = piVar3->block + uVar5;
    uVar5 = uVar5 + 1;
  } while (*puVar1 == 0);
  if (piVar3->zero_blocks == 0) {
    pcVar4 = m_select_code_option;
  }
  else {
    piVar3->block_nonzero = 1;
    pcVar4 = m_encode_zero;
  }
LAB_00101e91:
  piVar3->mode = pcVar4;
  return (int)piVar3;
}

Assistant:

static int m_check_zero_block(struct aec_stream *strm)
{
    /**
       Check if input block is all zero.

       Aggregate consecutive zero blocks until we find !0 or reach the
       end of a segment or RSI.
    */

    struct internal_state *state = strm->state;
    uint32_t *p = state->block;

    size_t i;
    for (i = 0; i < strm->block_size; i++)
        if (p[i] != 0)
            break;

    if (i < strm->block_size) {
        if (state->zero_blocks) {
            /* The current block isn't zero but we have to emit a
             * previous zero block first. The current block will be
             * flagged and handled later.
             */
            state->block_nonzero = 1;
            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_select_code_option;
        return M_CONTINUE;
    } else {
        state->zero_blocks++;
        if (state->zero_blocks == 1) {
            state->zero_ref = state->ref;
            state->zero_ref_sample = state->ref_sample;
        }
        if (state->blocks_avail == 0 || state->blocks_dispensed % 64 == 0) {
            if (state->zero_blocks > 4)
                state->zero_blocks = ROS;

            state->mode = m_encode_zero;
            return M_CONTINUE;
        }
        state->mode = m_get_block;
        return M_CONTINUE;
    }
}